

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O2

void __thiscall
duckdb_re2::NFA::AddToThreadq
          (NFA *this,Threadq *q,int id0,int c,StringPiece *context,char *p,Thread *t0)

{
  Inst *this_00;
  ushort uVar1;
  int iVar2;
  AddState *pAVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  long lVar7;
  Thread *pTVar8;
  Thread *pTVar9;
  ostream *poVar10;
  int iVar11;
  Thread **ppTVar12;
  uint uVar13;
  ulong local_1d8;
  Thread *local_1b0;
  ostringstream local_1a8 [376];
  
  if (id0 != 0) {
    pAVar3 = (this->stack_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::NFA::AddState,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::NFA::AddState_*,_duckdb_re2::PODArray<duckdb_re2::NFA::AddState>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::NFA::AddState_*,_false>._M_head_impl;
    pAVar3->id = id0;
    pAVar3->t = (Thread *)0x0;
    local_1d8 = 1;
switchD_01b22d72_caseD_7:
    if (0 < (int)local_1d8) {
      local_1d8 = (ulong)((int)local_1d8 - 1);
      uVar13 = pAVar3[local_1d8].id;
      pTVar8 = pAVar3[local_1d8].t;
LAB_01b22cdf:
      pTVar9 = t0;
      if ((pTVar8 != (Thread *)0x0) &&
         (iVar2 = (t0->field_0).ref, (t0->field_0).ref = iVar2 + -1, pTVar9 = pTVar8, iVar2 < 2)) {
        t0->field_0 = (anon_union_8_2_62753a03_for_Thread_0)this->freelist_;
        this->freelist_ = t0;
      }
      t0 = pTVar9;
      if ((uVar13 == 0) ||
         (bVar4 = SparseArray<duckdb_re2::NFA::Thread_*>::has_index(q,uVar13), bVar4))
      goto switchD_01b22d72_caseD_7;
      local_1b0 = (Thread *)0x0;
      SparseArray<duckdb_re2::NFA::Thread_*>::set_new(q,uVar13,&local_1b0);
      ppTVar12 = &(q->dense_).ptr_._M_t.
                  super___uniq_ptr_impl<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue>::Deleter>
                  .
                  super__Head_base<0UL,_duckdb_re2::SparseArray<duckdb_re2::NFA::Thread_*>::IndexValue_*,_false>
                  ._M_head_impl
                  [(q->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar13]].value_;
      this_00 = ((_Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false> *)
                ((long)&(this->prog_->inst_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                + 8))->_M_head_impl + (int)uVar13;
      uVar5 = this_00->out_opcode_;
      lVar7 = (long)(int)local_1d8;
      pTVar9 = t0;
      switch(uVar5 & 7) {
      case 0:
        local_1b0 = (Thread *)((ulong)local_1b0 & 0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        poVar10 = std::operator<<((ostream *)local_1a8,"unhandled ");
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,this_00->out_opcode_ & 7);
        std::operator<<(poVar10," in AddToThreadq");
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        goto switchD_01b22d72_caseD_7;
      case 1:
        (t0->field_0).ref = (t0->field_0).ref + 1;
        *ppTVar12 = t0;
        uVar5 = 1;
        break;
      case 2:
        bVar4 = Prog::Inst::Matches(this_00,c);
        if (!bVar4) goto LAB_01b22db1;
        (t0->field_0).ref = (t0->field_0).ref + 1;
        *ppTVar12 = t0;
        uVar1 = (this_00->field_1).byte_range.hint_foldcase_;
        if (uVar1 < 2) goto switchD_01b22d72_caseD_7;
        uVar5 = (uint)(uVar1 >> 1);
        break;
      case 3:
        if ((uVar5 & 8) == 0) {
          local_1d8 = (ulong)((int)local_1d8 + 1);
          pAVar3[lVar7].id = uVar13 + 1;
          pAVar3[lVar7].t = (Thread *)0x0;
        }
        iVar2 = (this_00->field_1).cap_;
        if (iVar2 < this->ncapture_) {
          iVar11 = (int)local_1d8;
          local_1d8 = (ulong)(iVar11 + 1);
          pAVar3[iVar11].id = 0;
          pAVar3[iVar11].t = t0;
          pTVar9 = AllocThread(this);
          memmove(pTVar9->capture,t0->capture,(long)this->ncapture_ << 3);
          pTVar9->capture[iVar2] = p;
        }
        goto LAB_01b22eab;
      case 4:
        if ((uVar5 & 8) == 0) {
          local_1d8 = (ulong)((int)local_1d8 + 1);
          pAVar3[lVar7].id = uVar13 + 1;
          pAVar3[lVar7].t = (Thread *)0x0;
        }
        uVar13 = (this_00->field_1).out1_;
        uVar6 = Prog::EmptyFlags(context,p);
        if ((uVar13 & ~uVar6) == 0) goto LAB_01b22eab;
        goto switchD_01b22d72_caseD_7;
      case 5:
        (t0->field_0).ref = (t0->field_0).ref + 1;
        *ppTVar12 = t0;
LAB_01b22db1:
        uVar5 = 1;
        if ((this_00->out_opcode_ & 8) != 0) goto switchD_01b22d72_caseD_7;
        break;
      case 6:
        if ((uVar5 & 8) == 0) {
          local_1d8 = (ulong)((int)local_1d8 + 1);
          pAVar3[lVar7].id = uVar13 + 1;
          pAVar3[lVar7].t = (Thread *)0x0;
        }
LAB_01b22eab:
        uVar13 = this_00->out_opcode_ >> 4;
        pTVar8 = (Thread *)0x0;
        t0 = pTVar9;
        goto LAB_01b22cdf;
      case 7:
        goto switchD_01b22d72_caseD_7;
      }
      uVar13 = uVar13 + uVar5;
      pTVar8 = (Thread *)0x0;
      goto LAB_01b22cdf;
    }
  }
  return;
}

Assistant:

void NFA::AddToThreadq(Threadq* q, int id0, int c, const StringPiece& context,
                       const char* p, Thread* t0) {
  if (id0 == 0)
    return;

  // Use stack_ to hold our stack of instructions yet to process.
  // It was preallocated as follows:
  //   two entries per Capture;
  //   one entry per EmptyWidth; and
  //   one entry per Nop.
  // This reflects the maximum number of stack pushes that each can
  // perform. (Each instruction can be processed at most once.)
  AddState* stk = stack_.data();
  int nstk = 0;

  stk[nstk++] = {id0, NULL};
  while (nstk > 0) {
    DCHECK_LE(nstk, stack_.size());
    AddState a = stk[--nstk];

  Loop:
    if (a.t != NULL) {
      // t0 was a thread that we allocated and copied in order to
      // record the capture, so we must now decref it.
      Decref(t0);
      t0 = a.t;
    }

    int id = a.id;
    if (id == 0)
      continue;
    if (q->has_index(id)) {
      continue;
    }

    // Create entry in q no matter what.  We might fill it in below,
    // or we might not.  Even if not, it is necessary to have it,
    // so that we don't revisit id0 during the recursion.
    q->set_new(id, NULL);
    Thread** tp = &q->get_existing(id);
    int j;
    Thread* t;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
    default:
      LOG(DFATAL) << "unhandled " << ip->opcode() << " in AddToThreadq";
      break;

    case kInstFail:
      break;

    case kInstAltMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      DCHECK(!ip->last());
      a = {id+1, NULL};
      goto Loop;

    case kInstNop:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on.
      a = {ip->out(), NULL};
      goto Loop;

    case kInstCapture:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      if ((j=ip->cap()) < ncapture_) {
        // Push a dummy whose only job is to restore t0
        // once we finish exploring this possibility.
        stk[nstk++] = {0, t0};

        // Record capture.
        t = AllocThread();
        CopyCapture(t->capture, t0->capture);
        t->capture[j] = p;
        t0 = t;
      }
      a = {ip->out(), NULL};
      goto Loop;

    case kInstByteRange:
      if (!ip->Matches(c))
        goto Next;

      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

      if (ip->hint() == 0)
        break;
      a = {id+ip->hint(), NULL};
      goto Loop;

    case kInstMatch:
      // Save state; will pick up at next byte.
      t = Incref(t0);
      *tp = t;

    Next:
      if (ip->last())
        break;
      a = {id+1, NULL};
      goto Loop;

    case kInstEmptyWidth:
      if (!ip->last())
        stk[nstk++] = {id+1, NULL};

      // Continue on if we have all the right flag bits.
      if (ip->empty() & ~Prog::EmptyFlags(context, p))
        break;
      a = {ip->out(), NULL};
      goto Loop;
    }
  }
}